

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

void Abc_NamPrint(Abc_Nam_t *p,char *pFileName)

{
  int iVar1;
  char *pcVar2;
  FILE *local_30;
  uint local_28;
  int i;
  int h;
  FILE *pFile;
  char *pFileName_local;
  Abc_Nam_t *p_local;
  
  if (pFileName == (char *)0x0) {
    local_30 = _stdout;
  }
  else {
    local_30 = fopen(pFileName,"wb");
  }
  if (local_30 == (FILE *)0x0) {
    printf("Count node open file %s\n",pFileName);
  }
  else {
    for (local_28 = 1; iVar1 = Vec_IntSize(&p->vInt2Handle), (int)local_28 < iVar1;
        local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(&p->vInt2Handle,local_28);
      pcVar2 = Abc_NamHandleToStr(p,iVar1);
      fprintf(local_30,"%8d = %s\n",(ulong)local_28,pcVar2);
    }
    if (local_30 != _stdout) {
      fclose(local_30);
    }
  }
  return;
}

Assistant:

void Abc_NamPrint( Abc_Nam_t * p, char * pFileName )
{
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    int h, i;
    if ( pFile == NULL ) { printf( "Count node open file %s\n", pFileName ); return; }
    Vec_IntForEachEntryStart( &p->vInt2Handle, h, i, 1 )
        fprintf( pFile, "%8d = %s\n", i, Abc_NamHandleToStr(p, h) );
    if ( pFile != stdout )
        fclose(pFile);
}